

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O0

void __thiscall r_exec::Group::cov(Group *this)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  pointer pvVar4;
  reference pPVar5;
  View *pVVar6;
  Code *pCVar7;
  _Mem *this_00;
  P *this_01;
  _Self local_48;
  _Base_ptr local_40;
  _Rb_tree_const_iterator<core::P<r_exec::View>_> local_38;
  const_iterator v;
  _Node_iterator_base<std::pair<r_exec::Group_*const,_bool>,_false> local_28;
  _Node_iterator_base<std::pair<r_exec::Group_*const,_bool>,_false> local_20;
  _Node_iterator_base<std::pair<r_exec::Group_*const,_bool>,_false> local_18;
  const_iterator vg;
  Group *this_local;
  
  vg.super__Node_iterator_base<std::pair<r_exec::Group_*const,_bool>,_false>._M_cur =
       (_Node_iterator_base<std::pair<r_exec::Group_*const,_bool>,_false>)
       (_Node_iterator_base<std::pair<r_exec::Group_*const,_bool>,_false>)this;
  std::__detail::_Node_const_iterator<std::pair<r_exec::Group_*const,_bool>,_false,_false>::
  _Node_const_iterator
            ((_Node_const_iterator<std::pair<r_exec::Group_*const,_bool>,_false,_false> *)&local_18)
  ;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<r_exec::Group_*,_bool,_std::hash<r_exec::Group_*>,_std::equal_to<r_exec::Group_*>,_std::allocator<std::pair<r_exec::Group_*const,_bool>_>_>
       ::begin(&this->viewing_groups);
  std::__detail::_Node_const_iterator<std::pair<r_exec::Group_*const,_bool>,_false,_false>::
  _Node_const_iterator
            ((_Node_const_iterator<std::pair<r_exec::Group_*const,_bool>,_false,_false> *)&local_20,
             (_Node_iterator<std::pair<r_exec::Group_*const,_bool>,_false,_false> *)&local_28);
  local_18._M_cur = local_20._M_cur;
  while( true ) {
    v._M_node = (_Base_ptr)
                std::
                unordered_map<r_exec::Group_*,_bool,_std::hash<r_exec::Group_*>,_std::equal_to<r_exec::Group_*>,_std::allocator<std::pair<r_exec::Group_*const,_bool>_>_>
                ::end(&this->viewing_groups);
    bVar1 = std::__detail::operator!=
                      (&local_18,
                       (_Node_iterator_base<std::pair<r_exec::Group_*const,_bool>,_false> *)&v);
    if (!bVar1) break;
    pvVar4 = std::__detail::
             _Node_const_iterator<std::pair<r_exec::Group_*const,_bool>,_false,_false>::operator->
                       ((_Node_const_iterator<std::pair<r_exec::Group_*const,_bool>,_false,_false> *
                        )&local_18);
    if ((pvVar4->second & 1U) != 0) {
      std::_Rb_tree_const_iterator<core::P<r_exec::View>_>::_Rb_tree_const_iterator(&local_38);
      local_40 = (_Base_ptr)
                 std::
                 multiset<core::P<r_exec::View>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>
                 ::begin(&this->newly_salient_views);
      local_38._M_node = local_40;
      while( true ) {
        local_48._M_node =
             (_Base_ptr)
             std::
             multiset<core::P<r_exec::View>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>
             ::end(&this->newly_salient_views);
        bVar1 = std::operator!=(&local_38,&local_48);
        if (!bVar1) break;
        pPVar5 = std::_Rb_tree_const_iterator<core::P<r_exec::View>_>::operator*(&local_38);
        pVVar6 = core::P<r_exec::View>::operator->(pPVar5);
        uVar3 = (*(pVVar6->super_View).super__Object._vptr__Object[2])();
        if ((uVar3 & 1) == 0) {
          pPVar5 = std::_Rb_tree_const_iterator<core::P<r_exec::View>_>::operator*(&local_38);
          pVVar6 = core::P<r_exec::View>::operator->(pPVar5);
          pCVar7 = core::P<r_code::Code>::operator->(&(pVVar6->super_View).object);
          (*(pCVar7->super__Object)._vptr__Object[4])(pCVar7,0);
          bVar2 = r_code::Atom::getDescriptor();
          if (7 < bVar2 - 200) {
            this_00 = _Mem::Get();
            this_01 = (P *)std::_Rb_tree_const_iterator<core::P<r_exec::View>_>::operator*
                                     (&local_38);
            pVVar6 = core::P::operator_cast_to_View_(this_01);
            pvVar4 = std::__detail::
                     _Node_const_iterator<std::pair<r_exec::Group_*const,_bool>,_false,_false>::
                     operator->((_Node_const_iterator<std::pair<r_exec::Group_*const,_bool>,_false,_false>
                                 *)&local_18);
            _Mem::inject_copy(this_00,pVVar6,pvVar4->first);
          }
        }
        std::_Rb_tree_const_iterator<core::P<r_exec::View>_>::operator++(&local_38);
      }
    }
    std::__detail::_Node_const_iterator<std::pair<r_exec::Group_*const,_bool>,_false,_false>::
    operator++((_Node_const_iterator<std::pair<r_exec::Group_*const,_bool>,_false,_false> *)
               &local_18);
  }
  return;
}

Assistant:

void Group::cov()
{
    // cov, i.e. injecting now newly salient views in the viewing groups from which the group is visible and has cov.
    // reduction jobs will be added at each of the eligible viewing groups' own update time.
    std::unordered_map<Group *, bool>::const_iterator vg;

    for (vg = viewing_groups.begin(); vg != viewing_groups.end(); ++vg) {
        if (vg->second) { // cov==true.
            std::multiset<P<View>, r_code::View::Less>::const_iterator v;

            for (v = newly_salient_views.begin(); v != newly_salient_views.end(); ++v) { // no cov for pgm (all sorts), groups, notifications.
                if ((*v)->isNotification()) {
                    continue;
                }

                switch ((*v)->object->code(0).getDescriptor()) {
                case Atom::GROUP:
                case Atom::NULL_PROGRAM:
                case Atom::INSTANTIATED_PROGRAM:
                case Atom::INSTANTIATED_CPP_PROGRAM:
                case Atom::INSTANTIATED_INPUT_LESS_PROGRAM:
                case Atom::INSTANTIATED_ANTI_PROGRAM:
                case Atom::COMPOSITE_STATE:
                case Atom::MODEL:
                    break;

                default:
                    _Mem::Get()->inject_copy(*v, vg->first); // no need to protect group->newly_salient_views[i] since the support values for the ctrl values are not even read.
                    break;
                }
            }
        }
    }
}